

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MultilineTextBox.cpp
# Opt level: O1

bool __thiscall
gui::MultilineTextBox::insertCharacter(MultilineTextBox *this,uint32_t unicode,bool suppressSignals)

{
  pair<sf::Vector2<unsigned_long>,_bool> *ppVar1;
  vector<sf::String,_std::allocator<sf::String>_> *this_00;
  long lVar2;
  unsigned_long uVar3;
  unsigned_long uVar4;
  unsigned_long uVar5;
  pointer pSVar6;
  bool bVar7;
  bool bVar8;
  pair<sf::Vector2<unsigned_long>,_bool> *ppVar9;
  size_t sVar10;
  size_t sVar11;
  undefined7 in_register_00000011;
  Vector2<unsigned_long> *pVVar12;
  unsigned_long uVar13;
  ulong uVar14;
  long lVar15;
  long lVar16;
  long lVar17;
  ulong uVar18;
  String *x_1;
  pointer pSVar19;
  String *x;
  String *pSVar20;
  String *x_2;
  wregex regex;
  vector<sf::String,_std::allocator<sf::String>_> lastBoxStrings;
  Vector2<unsigned_long> lastCaretPosition;
  Vector2<unsigned_long> lastScroll;
  wstring local_138;
  _Alloc_hider local_118;
  uint local_108 [4];
  long local_f8;
  ulong local_f0;
  Uint32 local_e8;
  undefined4 local_e4;
  size_t local_e0;
  size_t local_d8;
  size_t local_d0;
  wstring local_c8;
  String local_a8;
  vector<sf::String,_std::allocator<sf::String>_> local_88;
  String *local_68;
  long local_60;
  Vector2<unsigned_long> local_58;
  unsigned_long local_48;
  unsigned_long uStack_40;
  
  if (this->readOnly_ != false) {
    return false;
  }
  local_e4 = (undefined4)CONCAT71(in_register_00000011,suppressSignals);
  local_88.super__Vector_base<sf::String,_std::allocator<sf::String>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_88.super__Vector_base<sf::String,_std::allocator<sf::String>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_88.super__Vector_base<sf::String,_std::allocator<sf::String>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_48 = 0;
  uStack_40 = 0;
  local_58.x = 0;
  local_58.y = 0;
  std::locale::locale((locale *)&local_118);
  sf::String::String((String *)&local_138,".*",(locale *)&local_118);
  local_68 = &this->regexPattern_;
  bVar7 = sf::operator!=(local_68,(String *)&local_138);
  if ((Vector2<unsigned_long> *)local_138._M_dataplus._M_p !=
      (Vector2<unsigned_long> *)&local_138.field_2) {
    operator_delete(local_138._M_dataplus._M_p);
  }
  std::locale::~locale((locale *)&local_118);
  if (bVar7) {
    std::vector<sf::String,_std::allocator<sf::String>_>::operator=(&local_88,&this->boxStrings_);
    local_48 = (this->scroll_).x;
    uStack_40 = (this->scroll_).y;
    local_58.x = (this->caretPosition_).x;
    local_58.y = (this->caretPosition_).y;
  }
  if ((this->selectionStart_).second == true) {
    ppVar1 = &this->selectionStart_;
    pVVar12 = &this->selectionEnd_;
    uVar14 = (this->selectionEnd_).y;
    uVar18 = (this->selectionStart_).first.y;
    if ((uVar18 < uVar14) ||
       ((ppVar9 = ppVar1, uVar18 == uVar14 && ((ppVar1->first).x < pVVar12->x)))) {
      ppVar9 = (pair<sf::Vector2<unsigned_long>,_bool> *)pVVar12;
      pVVar12 = &ppVar1->first;
    }
    uVar14 = pVVar12->y;
    local_138._0_16_ = *pVVar12;
    local_138.field_2._M_allocated_capacity = (ppVar9->first).x;
    uVar18 = (ppVar9->first).y;
    local_60 = uVar14 - uVar18;
    local_138.field_2._8_8_ = uVar18;
    local_e8 = unicode;
    if (uVar14 < uVar18 || local_60 == 0) {
      this_00 = &this->boxStrings_;
      local_e0 = 0xffffffffffffffff;
      lVar17 = uVar14 << 5;
      lVar16 = 0;
      lVar15 = lVar17;
      local_f8 = lVar17;
      local_f0 = uVar18;
      local_d8 = local_138.field_2._M_allocated_capacity;
      local_d0 = ((Vector2<unsigned_long> *)&pVVar12->x)->x;
      do {
        if (lVar16 == 0) {
          if (local_60 + lVar16 == 0) {
            sf::String::substring
                      ((String *)&local_c8,
                       (String *)
                       ((long)&(((this->boxStrings_).
                                 super__Vector_base<sf::String,_std::allocator<sf::String>_>._M_impl
                                 .super__Vector_impl_data._M_start)->m_string)._M_dataplus._M_p +
                       lVar17),0,local_d0);
            sf::String::substring
                      (&local_a8,
                       (String *)
                       ((long)&(((this->boxStrings_).
                                 super__Vector_base<sf::String,_std::allocator<sf::String>_>._M_impl
                                 .super__Vector_impl_data._M_start)->m_string)._M_dataplus._M_p +
                       lVar17),local_d8,local_e0);
            sf::operator+((String *)&local_118,(String *)&local_c8,&local_a8);
            sf::String::operator=
                      ((String *)
                       ((long)&(((this->boxStrings_).
                                 super__Vector_base<sf::String,_std::allocator<sf::String>_>._M_impl
                                 .super__Vector_impl_data._M_start)->m_string)._M_dataplus._M_p +
                       lVar17),(String *)&local_118);
            if (local_118._M_p != local_108) {
              operator_delete(local_118._M_p);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>_11
                 *)local_a8.m_string._M_dataplus._M_p != &local_a8.m_string.field_2) {
              operator_delete(local_a8.m_string._M_dataplus._M_p);
            }
            lVar15 = local_f8;
            uVar18 = local_f0;
            if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
                 *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
              operator_delete(local_c8._M_dataplus._M_p);
              lVar15 = local_f8;
              uVar18 = local_f0;
            }
          }
          else {
            sf::String::substring
                      ((String *)&local_118,
                       (String *)
                       ((long)&(((this->boxStrings_).
                                 super__Vector_base<sf::String,_std::allocator<sf::String>_>._M_impl
                                 .super__Vector_impl_data._M_start)->m_string)._M_dataplus._M_p +
                       lVar17),0,local_d0);
            sf::String::operator=
                      ((String *)
                       ((long)&(((this->boxStrings_).
                                 super__Vector_base<sf::String,_std::allocator<sf::String>_>._M_impl
                                 .super__Vector_impl_data._M_start)->m_string)._M_dataplus._M_p +
                       lVar17),(String *)&local_118);
            lVar15 = local_f8;
            uVar18 = local_f0;
            if (local_118._M_p != local_108) {
              operator_delete(local_118._M_p);
              lVar15 = local_f8;
              uVar18 = local_f0;
            }
          }
        }
        else if (uVar14 + lVar16 < uVar18 && uVar14 < uVar14 + lVar16) {
          std::vector<sf::String,_std::allocator<sf::String>_>::_M_erase
                    (this_00,(String *)
                             ((long)&(this_00->
                                     super__Vector_base<sf::String,_std::allocator<sf::String>_>).
                                     _M_impl.super__Vector_impl_data._M_start[1].m_string.
                                     _M_dataplus._M_p + local_f8));
          lVar15 = local_f8;
          uVar18 = local_f0;
        }
        else if (local_60 + lVar16 == 0) {
          sf::String::substring
                    ((String *)&local_118,
                     (String *)
                     ((long)&(this_00->super__Vector_base<sf::String,_std::allocator<sf::String>_>).
                             _M_impl.super__Vector_impl_data._M_start[1].m_string._M_dataplus._M_p +
                     lVar15),local_d8,local_e0);
          sf::String::operator+=
                    ((String *)
                     ((long)&(((this_00->super__Vector_base<sf::String,_std::allocator<sf::String>_>
                               )._M_impl.super__Vector_impl_data._M_start)->m_string)._M_dataplus.
                             _M_p + lVar15),(String *)&local_118);
          if (local_118._M_p != local_108) {
            operator_delete(local_118._M_p);
          }
          lVar15 = local_f8;
          std::vector<sf::String,_std::allocator<sf::String>_>::_M_erase
                    (this_00,(String *)
                             ((long)&(this_00->
                                     super__Vector_base<sf::String,_std::allocator<sf::String>_>).
                                     _M_impl.super__Vector_impl_data._M_start[1].m_string.
                                     _M_dataplus._M_p + local_f8));
          uVar18 = local_f0;
        }
        lVar2 = uVar14 + lVar16;
        lVar16 = lVar16 + 1;
        lVar17 = lVar17 + 0x20;
      } while (lVar2 + 1U <= uVar18);
    }
    uVar13 = (this->selectionStart_).first.x;
    uVar3 = (this->selectionStart_).first.y;
    uVar4 = (this->selectionEnd_).x;
    uVar5 = (this->selectionEnd_).y;
    updateCaretPosition(this,(Vector2<unsigned_long> *)&local_138,false);
    bVar7 = uVar3 != uVar5 || uVar13 != uVar4;
    unicode = local_e8;
  }
  else {
    bVar7 = false;
  }
  pVVar12 = &this->caretPosition_;
  sVar10 = findCaretOffset(this,pVVar12);
  if ((int)unicode < 10) {
    if (unicode == 8) {
      if ((sVar10 == 0) || (bVar7 != false)) goto LAB_0019416e;
      pSVar19 = (this->boxStrings_).super__Vector_base<sf::String,_std::allocator<sf::String>_>.
                _M_impl.super__Vector_impl_data._M_start;
      uVar13 = (this->caretPosition_).x;
      uVar3 = (this->caretPosition_).y;
      pSVar20 = pSVar19 + uVar3;
      if (uVar13 == 0) {
        sf::String::operator+=(pSVar19 + (uVar3 - 1),pSVar20);
        std::vector<sf::String,_std::allocator<sf::String>_>::_M_erase
                  (&this->boxStrings_,
                   (this->boxStrings_).super__Vector_base<sf::String,_std::allocator<sf::String>_>.
                   _M_impl.super__Vector_impl_data._M_start + (this->caretPosition_).y);
      }
      else {
        sf::String::erase(pSVar20,uVar13 - 1,1);
      }
      uVar13 = (this->scroll_).x;
      if (uVar13 != 0) {
        uVar3 = (this->sizeCharacters_).x;
        pSVar6 = (this->boxStrings_).super__Vector_base<sf::String,_std::allocator<sf::String>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
        uVar14 = 0;
        for (pSVar19 = (this->boxStrings_).
                       super__Vector_base<sf::String,_std::allocator<sf::String>_>._M_impl.
                       super__Vector_impl_data._M_start; pSVar19 != pSVar6; pSVar19 = pSVar19 + 1) {
          sVar11 = sf::String::getSize(pSVar19);
          if (uVar14 <= sVar11) {
            uVar14 = sVar11;
          }
        }
        if (uVar14 < uVar3 + uVar13) {
          (this->scroll_).x = (this->scroll_).x - 1;
        }
      }
      local_138._0_16_ = findCaretPosition(this,sVar10 - 1);
      updateCaretPosition(this,(Vector2<unsigned_long> *)&local_138,false);
    }
    else {
      if (unicode == 9) {
        uVar14 = pVVar12->x | 0xfffffffffffffffc;
        do {
          bVar8 = insertCharacter(this,0x20,true);
          if (bVar8) {
            bVar7 = true;
          }
          uVar14 = uVar14 + 1;
        } while (uVar14 != 0);
        goto LAB_0019416e;
      }
LAB_00193d8f:
      if (this->maxCharacters_ != 0) {
        pSVar6 = (this->boxStrings_).super__Vector_base<sf::String,_std::allocator<sf::String>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
        lVar15 = 0;
        for (pSVar19 = (this->boxStrings_).
                       super__Vector_base<sf::String,_std::allocator<sf::String>_>._M_impl.
                       super__Vector_impl_data._M_start; pSVar19 != pSVar6; pSVar19 = pSVar19 + 1) {
          sVar11 = sf::String::getSize(pSVar19);
          lVar15 = lVar15 + sVar11 + 1;
        }
        uVar14 = 0;
        if (lVar15 != 0) {
          uVar14 = lVar15 - 1;
        }
        if (this->maxCharacters_ <= uVar14) goto LAB_0019416e;
      }
      uVar13 = (this->caretPosition_).y;
      pSVar19 = (this->boxStrings_).super__Vector_base<sf::String,_std::allocator<sf::String>_>.
                _M_impl.super__Vector_impl_data._M_start;
      sVar11 = (this->caretPosition_).x;
      sf::String::String((String *)&local_138,unicode);
      sf::String::insert(pSVar19 + uVar13,sVar11,(String *)&local_138);
      if ((Vector2<unsigned_long> *)local_138._M_dataplus._M_p !=
          (Vector2<unsigned_long> *)&local_138.field_2) {
        operator_delete(local_138._M_dataplus._M_p);
      }
      local_138._0_16_ = findCaretPosition(this,sVar10 + 1);
      updateCaretPosition(this,(Vector2<unsigned_long> *)&local_138,false);
    }
  }
  else {
    if (unicode == 0x7f) {
      if (bVar7 == false) {
        pSVar6 = (this->boxStrings_).super__Vector_base<sf::String,_std::allocator<sf::String>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
        lVar15 = 0;
        for (pSVar19 = (this->boxStrings_).
                       super__Vector_base<sf::String,_std::allocator<sf::String>_>._M_impl.
                       super__Vector_impl_data._M_start; pSVar19 != pSVar6; pSVar19 = pSVar19 + 1) {
          sVar11 = sf::String::getSize(pSVar19);
          lVar15 = lVar15 + sVar11 + 1;
        }
        uVar14 = 0;
        if (lVar15 != 0) {
          uVar14 = lVar15 - 1;
        }
        if (sVar10 < uVar14) {
          sVar10 = (this->caretPosition_).x;
          sVar11 = sf::String::getSize((this->boxStrings_).
                                       super__Vector_base<sf::String,_std::allocator<sf::String>_>.
                                       _M_impl.super__Vector_impl_data._M_start +
                                       (this->caretPosition_).y);
          pSVar20 = (this->boxStrings_).super__Vector_base<sf::String,_std::allocator<sf::String>_>.
                    _M_impl.super__Vector_impl_data._M_start + (this->caretPosition_).y;
          if (sVar10 == sVar11) {
            sf::String::operator+=(pSVar20,pSVar20 + 1);
            std::vector<sf::String,_std::allocator<sf::String>_>::_M_erase
                      (&this->boxStrings_,
                       (this->boxStrings_).
                       super__Vector_base<sf::String,_std::allocator<sf::String>_>._M_impl.
                       super__Vector_impl_data._M_start + (this->caretPosition_).y + 1);
          }
          else {
            sf::String::erase(pSVar20,pVVar12->x,1);
          }
          uVar13 = (this->scroll_).x;
          if (uVar13 != 0) {
            uVar3 = (this->sizeCharacters_).x;
            pSVar6 = (this->boxStrings_).super__Vector_base<sf::String,_std::allocator<sf::String>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
            uVar14 = 0;
            for (pSVar19 = (this->boxStrings_).
                           super__Vector_base<sf::String,_std::allocator<sf::String>_>._M_impl.
                           super__Vector_impl_data._M_start; pSVar19 != pSVar6;
                pSVar19 = pSVar19 + 1) {
              sVar10 = sf::String::getSize(pSVar19);
              if (uVar14 <= sVar10) {
                uVar14 = sVar10;
              }
            }
            if (uVar14 < uVar3 + uVar13) {
              (this->scroll_).x = (this->scroll_).x - 1;
            }
          }
          bVar7 = true;
          updateCaretPosition(this,pVVar12,false);
        }
      }
      goto LAB_0019416e;
    }
    if (unicode != 10) goto LAB_00193d8f;
    if (this->maxCharacters_ != 0) {
      pSVar6 = (this->boxStrings_).super__Vector_base<sf::String,_std::allocator<sf::String>_>.
               _M_impl.super__Vector_impl_data._M_finish;
      lVar15 = 0;
      for (pSVar19 = (this->boxStrings_).super__Vector_base<sf::String,_std::allocator<sf::String>_>
                     ._M_impl.super__Vector_impl_data._M_start; pSVar19 != pSVar6;
          pSVar19 = pSVar19 + 1) {
        sVar11 = sf::String::getSize(pSVar19);
        lVar15 = lVar15 + sVar11 + 1;
      }
      uVar14 = 0;
      if (lVar15 != 0) {
        uVar14 = lVar15 - 1;
      }
      if (this->maxCharacters_ <= uVar14) goto LAB_0019416e;
    }
    if ((this->maxLines_ != 0) &&
       (this->maxLines_ <=
        (ulong)((long)(this->boxStrings_).
                      super__Vector_base<sf::String,_std::allocator<sf::String>_>._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)(this->boxStrings_).
                      super__Vector_base<sf::String,_std::allocator<sf::String>_>._M_impl.
                      super__Vector_impl_data._M_start >> 5))) goto LAB_0019416e;
    pSVar20 = (this->boxStrings_).super__Vector_base<sf::String,_std::allocator<sf::String>_>.
              _M_impl.super__Vector_impl_data._M_start + (this->caretPosition_).y;
    sf::String::substring((String *)&local_138,pSVar20,(this->caretPosition_).x,0xffffffffffffffff);
    std::vector<sf::String,_std::allocator<sf::String>_>::_M_insert_rval
              (&this->boxStrings_,pSVar20 + 1,(value_type *)&local_138);
    if ((Vector2<unsigned_long> *)local_138._M_dataplus._M_p !=
        (Vector2<unsigned_long> *)&local_138.field_2) {
      operator_delete(local_138._M_dataplus._M_p);
    }
    sf::String::substring
              ((String *)&local_138,
               (this->boxStrings_).super__Vector_base<sf::String,_std::allocator<sf::String>_>.
               _M_impl.super__Vector_impl_data._M_start + (this->caretPosition_).y,0,
               (this->caretPosition_).x);
    sf::String::operator=
              ((this->boxStrings_).super__Vector_base<sf::String,_std::allocator<sf::String>_>.
               _M_impl.super__Vector_impl_data._M_start + (this->caretPosition_).y,
               (String *)&local_138);
    if ((Vector2<unsigned_long> *)local_138._M_dataplus._M_p !=
        (Vector2<unsigned_long> *)&local_138.field_2) {
      operator_delete(local_138._M_dataplus._M_p);
    }
    local_138._0_16_ = findCaretPosition(this,sVar10 + 1);
    updateCaretPosition(this,(Vector2<unsigned_long> *)&local_138,false);
  }
  bVar7 = true;
LAB_0019416e:
  std::locale::locale((locale *)&local_118);
  sf::String::String((String *)&local_138,".*",(locale *)&local_118);
  pSVar20 = local_68;
  bVar8 = sf::operator!=(local_68,(String *)&local_138);
  if ((Vector2<unsigned_long> *)local_138._M_dataplus._M_p !=
      (Vector2<unsigned_long> *)&local_138.field_2) {
    operator_delete(local_138._M_dataplus._M_p);
  }
  std::locale::~locale((locale *)&local_118);
  if (bVar8) {
    sf::String::toWideString_abi_cxx11_(&local_138,pSVar20);
    std::__cxx11::basic_regex<wchar_t,std::__cxx11::regex_traits<wchar_t>>::
    basic_regex<std::char_traits<wchar_t>,std::allocator<wchar_t>>
              ((basic_regex<wchar_t,std::__cxx11::regex_traits<wchar_t>> *)&local_118,&local_138,
               0x10);
    if ((Vector2<unsigned_long> *)local_138._M_dataplus._M_p !=
        (Vector2<unsigned_long> *)&local_138.field_2) {
      operator_delete(local_138._M_dataplus._M_p);
    }
    anon_unknown.dwarf_4523c8::combineStrings(&local_a8,&this->boxStrings_);
    sf::String::toWideString_abi_cxx11_(&local_c8,&local_a8);
    local_138.field_2._M_allocated_capacity = 0;
    local_138.field_2._8_8_ = 0;
    local_138._0_16_ = ZEXT816(0);
    bVar8 = std::__detail::
            __regex_algo_impl<__gnu_cxx::__normal_iterator<wchar_t_const*,std::__cxx11::wstring>,std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<wchar_t_const*,std::__cxx11::wstring>>>,wchar_t,std::__cxx11::regex_traits<wchar_t>,(std::__detail::_RegexExecutorPolicy)0,true>
                      ((__normal_iterator<const_wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
                        )local_c8._M_dataplus._M_p,
                       (__normal_iterator<const_wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
                        )(local_c8._M_dataplus._M_p + local_c8._M_string_length),
                       (match_results<__gnu_cxx::__normal_iterator<const_wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>_>_>
                        *)&local_138,
                       (basic_regex<wchar_t,_std::__cxx11::regex_traits<wchar_t>_> *)&local_118,0);
    if (local_138._M_dataplus._M_p != (pointer)0x0) {
      operator_delete(local_138._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
         *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
      operator_delete(local_c8._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>_11
         *)local_a8.m_string._M_dataplus._M_p != &local_a8.m_string.field_2) {
      operator_delete(local_a8.m_string._M_dataplus._M_p);
    }
    if (!bVar8) {
      std::vector<sf::String,_std::allocator<sf::String>_>::operator=(&this->boxStrings_,&local_88);
      (this->scroll_).x = local_48;
      (this->scroll_).y = uStack_40;
      bVar7 = false;
      updateCaretPosition(this,&local_58,false);
    }
    std::__cxx11::basic_regex<wchar_t,_std::__cxx11::regex_traits<wchar_t>_>::~basic_regex
              ((basic_regex<wchar_t,_std::__cxx11::regex_traits<wchar_t>_> *)&local_118);
  }
  if (((~bVar7 | (byte)local_e4) & 1) == 0) {
    pSVar6 = (this->boxStrings_).super__Vector_base<sf::String,_std::allocator<sf::String>_>._M_impl
             .super__Vector_impl_data._M_finish;
    lVar15 = 0;
    for (pSVar19 = (this->boxStrings_).super__Vector_base<sf::String,_std::allocator<sf::String>_>.
                   _M_impl.super__Vector_impl_data._M_start; pSVar19 != pSVar6;
        pSVar19 = pSVar19 + 1) {
      sVar10 = sf::String::getSize(pSVar19);
      lVar15 = lVar15 + sVar10 + 1;
    }
    uVar13 = 0;
    if (lVar15 != 0) {
      uVar13 = lVar15 - 1;
    }
    Signal<gui::Widget_*,_unsigned_long>::emit(&this->onTextChange,&this->super_Widget,uVar13);
  }
  std::vector<sf::String,_std::allocator<sf::String>_>::~vector(&local_88);
  return bVar7;
}

Assistant:

bool MultilineTextBox::insertCharacter(uint32_t unicode, bool suppressSignals) {
    if (readOnly_) {
        return false;
    }
    // For a regex pattern, first backup the state that we need to restore if the pattern match fails.
    std::vector<sf::String> lastBoxStrings;
    sf::Vector2<size_t> lastScroll, lastCaretPosition;
    if (regexPattern_ != ".*") {
        lastBoxStrings = boxStrings_;
        lastScroll = scroll_;
        lastCaretPosition = caretPosition_;
    }

    // Check if the selection will be replaced.
    bool textChanged = false, clearedSelection = false;
    if (selectionStart_.second) {
        auto selection = sortByYFirst(selectionStart_.first, selectionEnd_);
        for (size_t y = selection.first.y; y <= selection.second.y; ++y) {
            if (y == selection.first.y) {
                if (y == selection.second.y) {
                    boxStrings_[y] = boxStrings_[y].substring(0, selection.first.x) + boxStrings_[y].substring(selection.second.x);
                } else {
                    boxStrings_[y] = boxStrings_[y].substring(0, selection.first.x);
                }
            } else if (y > selection.first.y && y < selection.second.y) {
                boxStrings_.erase(boxStrings_.begin() + selection.first.y + 1);
            } else if (y == selection.second.y) {
                boxStrings_[selection.first.y] += boxStrings_[selection.first.y + 1].substring(selection.second.x);
                boxStrings_.erase(boxStrings_.begin() + selection.first.y + 1);
            }
        }
        if (selectionStart_.first != selectionEnd_) {
            textChanged = true;
            clearedSelection = true;
        }
        updateCaretPosition(selection.first, false);
    }
    size_t caretOffset = findCaretOffset(caretPosition_);

    if (unicode == '\u000a') {    // Enter key.
        if ((maxCharacters_ == 0 || findStringsLength(boxStrings_) < maxCharacters_) && (maxLines_ == 0 || boxStrings_.size() < maxLines_)) {
            boxStrings_.emplace(boxStrings_.begin() + caretPosition_.y + 1, boxStrings_[caretPosition_.y].substring(caretPosition_.x));
            boxStrings_[caretPosition_.y] = boxStrings_[caretPosition_.y].substring(0, caretPosition_.x);
            updateCaretPosition(caretOffset + 1, false);
            textChanged = true;
        }
    } else if (unicode == '\u0008') {    // Backspace key.
        if (!clearedSelection && caretOffset > 0) {
            if (caretPosition_.x == 0) {
                boxStrings_[caretPosition_.y - 1] += boxStrings_[caretPosition_.y];
                boxStrings_.erase(boxStrings_.begin() + caretPosition_.y);
            } else {
                boxStrings_[caretPosition_.y].erase(caretPosition_.x - 1, 1);
            }
            if (scroll_.x > 0 && scroll_.x + sizeCharacters_.x > findLongestLength(boxStrings_)) {
                --scroll_.x;
            }
            updateCaretPosition(caretOffset - 1, false);
            textChanged = true;
        }
    } else if (unicode == '\u0009') {    // Tab key.
        size_t count = 4 - caretPosition_.x % 4;
        for (size_t i = 0; i < count; ++i) {
            textChanged = insertCharacter(' ', true) || textChanged;
        }
    } else if (unicode == '\u007f') {    // Delete key.
        if (!clearedSelection && caretOffset < findStringsLength(boxStrings_)) {
            if (caretPosition_.x == boxStrings_[caretPosition_.y].getSize()) {
                boxStrings_[caretPosition_.y] += boxStrings_[caretPosition_.y + 1];
                boxStrings_.erase(boxStrings_.begin() + caretPosition_.y + 1);
            } else {
                boxStrings_[caretPosition_.y].erase(caretPosition_.x, 1);
            }
            if (scroll_.x > 0 && scroll_.x + sizeCharacters_.x > findLongestLength(boxStrings_)) {
                --scroll_.x;
            }
            updateCaretPosition(caretPosition_, false);
            textChanged = true;
        }
    } else {    // Printable character.
        if (maxCharacters_ == 0 || findStringsLength(boxStrings_) < maxCharacters_) {
            boxStrings_[caretPosition_.y].insert(caretPosition_.x, sf::String(unicode));
            updateCaretPosition(caretOffset + 1, false);
            textChanged = true;
        }
    }

    if (regexPattern_ != ".*") {
        std::wregex regex(regexPattern_.toWideString());
        if (!std::regex_match(combineStrings(boxStrings_).toWideString(), regex)) {
            GUI_DEBUG << "Regex pattern match failed, discarding character input.\n";
            boxStrings_ = lastBoxStrings;
            scroll_ = lastScroll;
            updateCaretPosition(lastCaretPosition, false);
            textChanged = false;
        }
    }

    if (textChanged && !suppressSignals) {
        onTextChange.emit(this, findStringsLength(boxStrings_));
    }
    return textChanged;
}